

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

Vec_Int_t * Fra_ClauSaveOutputVars(Aig_Man_t *pMan,Cnf_Dat_t *pCnf)

{
  int iVar1;
  Vec_Int_t *p;
  void *pvVar2;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vVars;
  Cnf_Dat_t *pCnf_local;
  Aig_Man_t *pMan_local;
  
  iVar1 = Aig_ManCoNum(pMan);
  p = Vec_IntAlloc(iVar1);
  for (local_2c = 0; iVar1 = Vec_PtrSize(pMan->vCos), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(pMan->vCos,local_2c);
    Vec_IntPush(p,pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)]);
  }
  return p;
}

Assistant:

Vec_Int_t * Fra_ClauSaveOutputVars( Aig_Man_t * pMan, Cnf_Dat_t * pCnf )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj;
    int i;
    vVars = Vec_IntAlloc( Aig_ManCoNum(pMan) );
    Aig_ManForEachCo( pMan, pObj, i )
        Vec_IntPush( vVars, pCnf->pVarNums[pObj->Id] );
    return vVars;
}